

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexCrisismerge(Fts5Index *p,Fts5Structure **ppStruct)

{
  bool bVar1;
  int local_2c;
  Fts5Structure *pFStack_28;
  int iLvl;
  Fts5Structure *pStruct;
  Fts5Structure **ppFStack_18;
  int nCrisis;
  Fts5Structure **ppStruct_local;
  Fts5Index *p_local;
  
  pStruct._4_4_ = p->pConfig->nCrisisMerge;
  pFStack_28 = *ppStruct;
  local_2c = 0;
  ppFStack_18 = ppStruct;
  ppStruct_local = (Fts5Structure **)p;
  while( true ) {
    bVar1 = false;
    if (*(int *)((long)ppStruct_local + 0x34) == 0) {
      bVar1 = pStruct._4_4_ <= pFStack_28->aLevel[local_2c].nSeg;
    }
    if (!bVar1) break;
    fts5IndexMergeLevel((Fts5Index *)ppStruct_local,&stack0xffffffffffffffd8,local_2c,(int *)0x0);
    fts5StructurePromote((Fts5Index *)ppStruct_local,local_2c + 1,pFStack_28);
    local_2c = local_2c + 1;
  }
  *ppFStack_18 = pFStack_28;
  return;
}

Assistant:

static void fts5IndexCrisismerge(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct        /* IN/OUT: Current structure of index */
){
  const int nCrisis = p->pConfig->nCrisisMerge;
  Fts5Structure *pStruct = *ppStruct;
  int iLvl = 0;

  assert( p->rc!=SQLITE_OK || pStruct->nLevel>0 );
  while( p->rc==SQLITE_OK && pStruct->aLevel[iLvl].nSeg>=nCrisis ){
    fts5IndexMergeLevel(p, &pStruct, iLvl, 0);
    assert( p->rc!=SQLITE_OK || pStruct->nLevel>(iLvl+1) );
    fts5StructurePromote(p, iLvl+1, pStruct);
    iLvl++;
  }
  *ppStruct = pStruct;
}